

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O0

int __thiscall QSyntaxHighlighter::previousBlockState(QSyntaxHighlighter *this)

{
  long lVar1;
  bool bVar2;
  QSyntaxHighlighterPrivate *this_00;
  QTextBlock *in_RDI;
  long in_FS_OFFSET;
  QSyntaxHighlighterPrivate *d;
  QTextBlock previous;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSyntaxHighlighter *)0x79b445);
  bVar2 = QTextBlock::isValid((QTextBlock *)this_00);
  if (bVar2) {
    QTextBlock::previous((QTextBlock *)&DAT_aaaaaaaaaaaaaaaa);
    bVar2 = QTextBlock::isValid((QTextBlock *)this_00);
    if (bVar2) {
      local_1c = QTextBlock::userState(in_RDI);
    }
    else {
      local_1c = -1;
    }
  }
  else {
    local_1c = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

int QSyntaxHighlighter::previousBlockState() const
{
    Q_D(const QSyntaxHighlighter);
    if (!d->currentBlock.isValid())
        return -1;

    const QTextBlock previous = d->currentBlock.previous();
    if (!previous.isValid())
        return -1;

    return previous.userState();
}